

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int xmlParse3986DecOctet(char **str)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  
  pcVar3 = *str;
  cVar1 = *pcVar3;
  if (9 < (byte)(cVar1 - 0x30U)) {
    return 1;
  }
  bVar2 = pcVar3[1];
  if (9 < (byte)(bVar2 - 0x30)) {
    pcVar3 = pcVar3 + 1;
    goto LAB_001564a5;
  }
  if (cVar1 == '0') {
LAB_00156440:
    if (((0x34 < bVar2 || cVar1 != '2') || (9 < (byte)(pcVar3[2] - 0x30U))) &&
       ((bVar2 != 0x35 || cVar1 != '2' || (pcVar3[2] < '0')))) {
      return 1;
    }
  }
  else {
    if (9 < (byte)(pcVar3[2] - 0x30U)) {
      pcVar3 = pcVar3 + 2;
      goto LAB_001564a5;
    }
    if ((cVar1 != '1') || (9 < (byte)(pcVar3[2] - 0x30U))) goto LAB_00156440;
  }
  pcVar3 = pcVar3 + 3;
LAB_001564a5:
  *str = pcVar3;
  return 0;
}

Assistant:

static int
xmlParse3986DecOctet(const char **str) {
    const char *cur = *str;

    if (!(ISA_DIGIT(cur)))
        return(1);
    if (!ISA_DIGIT(cur+1))
	cur++;
    else if ((*cur != '0') && (ISA_DIGIT(cur + 1)) && (!ISA_DIGIT(cur+2)))
	cur += 2;
    else if ((*cur == '1') && (ISA_DIGIT(cur + 1)) && (ISA_DIGIT(cur + 2)))
	cur += 3;
    else if ((*cur == '2') && (*(cur + 1) >= '0') &&
	     (*(cur + 1) <= '4') && (ISA_DIGIT(cur + 2)))
	cur += 3;
    else if ((*cur == '2') && (*(cur + 1) == '5') &&
	     (*(cur + 2) >= '0') && (*(cur + 1) <= '5'))
	cur += 3;
    else
        return(1);
    *str = cur;
    return(0);
}